

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O0

bool __thiscall nuraft::peer::need_to_reconnect(peer *this)

{
  bool bVar1;
  element_type *peVar2;
  mutex_type *in_RDI;
  lock_guard<std::mutex> l;
  timer_helper *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar3;
  atomic<bool> *in_stack_ffffffffffffffe8;
  byte local_1;
  
  bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffffe8);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffffe8);
    if ((bVar1) && (bVar1 = timer_helper::timeout(in_stack_00000028), bVar1)) {
      local_1 = 1;
    }
    else {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
      peVar2 = std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
                          &(in_RDI->super___mutex_base)._M_mutex.__data.__list.__next);
      if (peVar2 == (element_type *)0x0) {
        local_1 = 1;
      }
      uVar3 = (uint)(peVar2 == (element_type *)0x0);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x131747);
      if (uVar3 == 0) {
        local_1 = 0;
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool need_to_reconnect() {
        if (abandoned_) return false;

        if (reconn_scheduled_ && reconn_timer_.timeout()) {
            return true;
        }
        {   std::lock_guard<std::mutex> l(rpc_protector_);
            if (!rpc_.get()) {
                return true;
            }
        }
        return false;
    }